

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::SubDataToUndefinedCase::iterate(SubDataToUndefinedCase *this)

{
  GLenum target;
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  reference newRange;
  deUint8 *pdVar12;
  pointer pVVar13;
  size_t in_R9;
  __normal_iterator<tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_b8;
  __normal_iterator<tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_b0;
  __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_a8;
  const_iterator range_1;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_98;
  __normal_iterator<tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_80;
  __normal_iterator<tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_78;
  __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_70;
  const_iterator range;
  undefined1 local_60 [4];
  deUint32 buf;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> definedRanges;
  bool isOk;
  undefined1 local_38 [8];
  ReferenceBuffer refBuf;
  BufferVerifier verifier;
  deUint32 dataSeed;
  SubDataToUndefinedCase *this_local;
  
  pcVar11 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar11);
  BufferTestUtil::BufferVerifier::BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_38);
  definedRanges.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_60);
  BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_38,this->m_size);
  range._M_current._4_4_ = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_target,range._M_current._4_4_);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_target,(long)this->m_size,
             (void *)0x0,this->m_usage);
  BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
  local_78._M_current =
       (Vector<int,_2> *)
       std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::begin
                 (&this->m_ranges);
  __gnu_cxx::
  __normal_iterator<tcu::Vector<int,2>const*,std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>>
  ::__normal_iterator<tcu::Vector<int,2>*>
            ((__normal_iterator<tcu::Vector<int,2>const*,std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>>
              *)&local_70,&local_78);
  while( true ) {
    local_80._M_current =
         (Vector<int,_2> *)
         std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::end
                   (&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&local_70,&local_80);
    if (!bVar1) break;
    pdVar12 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_70);
    iVar3 = tcu::Vector<int,_2>::x(pVVar13);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_70);
    iVar4 = tcu::Vector<int,_2>::y(pVVar13);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_70);
    iVar5 = tcu::Vector<int,_2>::x(pVVar13);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_70);
    iVar6 = tcu::Vector<int,_2>::y(pVVar13);
    dVar7 = ::deInt32Hash(iVar5 + iVar6);
    BufferTestUtil::fillWithRandomBytes(pdVar12 + iVar3,iVar4,dVar2 ^ dVar7);
    target = this->m_target;
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_70);
    iVar3 = tcu::Vector<int,_2>::x(pVVar13);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_70);
    iVar4 = tcu::Vector<int,_2>::y(pVVar13);
    pdVar12 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_70);
    iVar5 = tcu::Vector<int,_2>::x(pVVar13);
    glu::CallLogWrapper::glBufferSubData
              (&(this->super_BufferCase).super_CallLogWrapper,target,(long)iVar3,(long)iVar4,
               pdVar12 + iVar5);
    newRange = __gnu_cxx::
               __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
               ::operator*(&local_70);
    addRangeToList(&local_98,
                   (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_60,
                   newRange);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator=
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_60,
               &local_98);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector(&local_98);
    range_1._M_current =
         (Vector<int,_2> *)
         __gnu_cxx::
         __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
         ::operator++(&local_70,0);
  }
  local_b0._M_current =
       (Vector<int,_2> *)
       std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::begin
                 ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_60);
  __gnu_cxx::
  __normal_iterator<tcu::Vector<int,2>const*,std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>>
  ::__normal_iterator<tcu::Vector<int,2>*>
            ((__normal_iterator<tcu::Vector<int,2>const*,std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>>
              *)&local_a8,&local_b0);
  while( true ) {
    local_b8._M_current =
         (Vector<int,_2> *)
         std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::end
                   ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_60);
    bVar1 = __gnu_cxx::operator!=(&local_a8,&local_b8);
    uVar10 = range._M_current._4_4_;
    if (!bVar1) break;
    pdVar12 = BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_a8);
    uVar8 = tcu::Vector<int,_2>::x(pVVar13);
    pVVar13 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_a8);
    uVar9 = tcu::Vector<int,_2>::y(pVVar13);
    uVar10 = BufferTestUtil::BufferVerifier::verify
                       ((BufferVerifier *)
                        &refBuf.m_data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(EVP_PKEY_CTX *)(ulong)uVar10,
                        pdVar12,(ulong)uVar8,(uchar *)(ulong)uVar9,in_R9);
    if ((uVar10 & 1) == 0) {
      definedRanges.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
    ::operator++(&local_a8,0);
  }
  BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,range._M_current._4_4_);
  pcVar11 = "Buffer verification failed";
  if ((definedRanges.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
    pcVar11 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (byte)~definedRanges.
                    super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & QP_TEST_RESULT_FAIL,
             pcVar11);
  std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
            ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)local_60);
  BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_38);
  BufferTestUtil::BufferVerifier::~BufferVerifier
            ((BufferVerifier *)
             &refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			dataSeed	= deStringHash(getName());
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		bool					isOk		= true;
		std::vector<tcu::IVec2>	definedRanges;

		refBuf.setSize(m_size);

		deUint32 buf = genBuffer();
		glBindBuffer(m_target, buf);

		// Initialize storage with glBufferData()
		glBufferData(m_target, m_size, DE_NULL, m_usage);
		checkError();

		// Fill specified ranges with glBufferSubData()
		for (vector<tcu::IVec2>::const_iterator range = m_ranges.begin(); range != m_ranges.end(); range++)
		{
			fillWithRandomBytes(refBuf.getPtr()+range->x(), range->y(), dataSeed ^ deInt32Hash(range->x()+range->y()));
			glBufferSubData(m_target, range->x(), range->y(), refBuf.getPtr()+range->x());

			// Mark range as defined
			definedRanges = addRangeToList(definedRanges, *range);
		}

		// Verify defined parts
		for (vector<tcu::IVec2>::const_iterator range = definedRanges.begin(); range != definedRanges.end(); range++)
		{
			if (!verifier.verify(buf, refBuf.getPtr(), range->x(), range->y()))
				isOk = false;
		}

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}